

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport2.c
# Opt level: O0

void ssh2_transport_timer(void *ctx,unsigned_long now)

{
  int iVar1;
  unsigned_long uVar2;
  unsigned_long ticks;
  unsigned_long mins;
  ssh2_transport_state *s;
  unsigned_long now_local;
  void *ctx_local;
  
  if (((*(byte *)((long)ctx + 400) & 1) == 0) && (now == *(unsigned_long *)((long)ctx + 0x198))) {
    iVar1 = conf_get_int(*(Conf **)((long)ctx + 0x98),0x1b);
    uVar2 = sanitise_rekey_time(iVar1,0x3c);
    if (uVar2 != 0) {
      if (uVar2 * 60000 - 30000 < now - *(long *)((long)ctx + 0x1a0)) {
        *(char **)((long)ctx + 0xb0) = "timeout";
        *(undefined4 *)((long)ctx + 0xb8) = 3;
        queue_idempotent_callback((IdempotentCallback *)((long)ctx + 0x548));
      }
      else {
        iVar1 = conf_get_int(*(Conf **)((long)ctx + 0x98),0x2d);
        if ((((iVar1 == 0) ||
             (ssh2_transport_gss_update((ssh2_transport_state *)ctx,false),
             (*(uint *)((long)ctx + 0x1c8) & 1) == 0)) || ((*(uint *)((long)ctx + 0x1c8) & 8) != 0))
           || ((*(uint *)((long)ctx + 0x1c8) & 6) == 0)) {
          ssh2_transport_timer_update((ssh2_transport_state *)ctx,0);
        }
        else {
          *(char **)((long)ctx + 0xb0) = "GSS credentials updated";
          *(undefined4 *)((long)ctx + 0xb8) = 5;
          queue_idempotent_callback((IdempotentCallback *)((long)ctx + 0x548));
        }
      }
    }
  }
  return;
}

Assistant:

static void ssh2_transport_timer(void *ctx, unsigned long now)
{
    struct ssh2_transport_state *s = (struct ssh2_transport_state *)ctx;
    unsigned long mins;
    unsigned long ticks;

    if (s->kex_in_progress || now != s->next_rekey)
        return;

    mins = sanitise_rekey_time(conf_get_int(s->conf, CONF_ssh_rekey_time), 60);
    if (mins == 0)
        return;

    /* Rekey if enough time has elapsed */
    ticks = mins * 60 * TICKSPERSEC;
    if (now - s->last_rekey > ticks - 30*TICKSPERSEC) {
        s->rekey_reason = "timeout";
        s->rekey_class = RK_NORMAL;
        queue_idempotent_callback(&s->ppl.ic_process_queue);
        return;
    }

#ifndef NO_GSSAPI
    /*
     * Rekey now if we have a new cred or context expires this cycle,
     * but not if this is unsafe.
     */
    if (conf_get_int(s->conf, CONF_gssapirekey)) {
        ssh2_transport_gss_update(s, false);
        if ((s->gss_status & GSS_KEX_CAPABLE) != 0 &&
            (s->gss_status & GSS_CTXT_MAYFAIL) == 0 &&
            (s->gss_status & (GSS_CRED_UPDATED|GSS_CTXT_EXPIRES)) != 0) {
            s->rekey_reason = "GSS credentials updated";
            s->rekey_class = RK_GSS_UPDATE;
            queue_idempotent_callback(&s->ppl.ic_process_queue);
            return;
        }
    }
#endif

    /* Try again later. */
    (void) ssh2_transport_timer_update(s, 0);
}